

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

Symbol * __thiscall
ByteCodeGenerator::AddSymbolToScope
          (ByteCodeGenerator *this,Scope *scope,char16 *key,int keyLength,ParseNode *varDecl,
          SymbolType symbolType)

{
  code *pcVar1;
  bool bVar2;
  ScopeType SVar3;
  ParseNodeVar *pPVar4;
  ParseNodeName *pPVar5;
  Symbol **ppSVar6;
  Scope *pSVar7;
  undefined4 *puVar8;
  Symbol *local_40;
  Symbol *sym;
  SymbolType symbolType_local;
  ParseNode *varDecl_local;
  int keyLength_local;
  char16 *key_local;
  Scope *scope_local;
  ByteCodeGenerator *this_local;
  
  if (varDecl->nop == 1) {
    pPVar5 = ParseNode::AsParseNodeName(varDecl);
    ppSVar6 = ParseNodeName::GetSymRef(pPVar5);
    if (ppSVar6 == (Symbol **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x704,"(varDecl->AsParseNodeName()->GetSymRef())",
                         "varDecl->AsParseNodeName()->GetSymRef()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pPVar5 = ParseNode::AsParseNodeName(varDecl);
    ppSVar6 = ParseNodeName::GetSymRef(pPVar5);
    local_40 = *ppSVar6;
  }
  else if (varDecl->nop - 0x51 < 3) {
    pPVar4 = ParseNode::AsParseNodeVar(varDecl);
    local_40 = pPVar4->sym;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x708,"(0)","0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
    local_40 = (Symbol *)0x0;
  }
  pSVar7 = Symbol::GetScope(local_40);
  if (pSVar7 != scope) {
    pSVar7 = Symbol::GetScope(local_40);
    SVar3 = Scope::GetScopeType(pSVar7);
    if (SVar3 != ScopeType_Parameter) {
      SVar3 = Scope::GetScopeType(scope);
      if ((SVar3 != ScopeType_Global) &&
         (SVar3 = Scope::GetScopeType(scope), SVar3 != ScopeType_GlobalEvalBlock)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x714,
                           "(scope->GetScopeType() == ScopeType_Global || scope->GetScopeType() == ScopeType_GlobalEvalBlock)"
                           ,
                           "scope->GetScopeType() == ScopeType_Global || scope->GetScopeType() == ScopeType_GlobalEvalBlock"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      Scope::AddNewSymbol(scope,local_40);
    }
  }
  if ((local_40 != (Symbol *)0x0) && (pSVar7 = Symbol::GetScope(local_40), pSVar7 != (Scope *)0x0))
  {
    pSVar7 = Symbol::GetScope(local_40);
    if (pSVar7 == scope) goto LAB_00b6ec17;
    pSVar7 = Symbol::GetScope(local_40);
    SVar3 = Scope::GetScopeType(pSVar7);
    if (SVar3 == ScopeType_Parameter) goto LAB_00b6ec17;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar8 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                     ,0x718,
                     "(sym && sym->GetScope() && (sym->GetScope() == scope || sym->GetScope()->GetScopeType() == ScopeType_Parameter))"
                     ,
                     "sym && sym->GetScope() && (sym->GetScope() == scope || sym->GetScope()->GetScopeType() == ScopeType_Parameter)"
                    );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar8 = 0;
LAB_00b6ec17:
  bVar2 = Symbol::NeedsScopeObject(local_40);
  if (bVar2) {
    Scope::SetIsObject(scope);
  }
  return local_40;
}

Assistant:

Symbol * ByteCodeGenerator::AddSymbolToScope(Scope *scope, const char16 *key, int keyLength, ParseNode *varDecl, SymbolType symbolType)
{
    Symbol *sym = nullptr;

    switch (varDecl->nop)
    {
    case knopConstDecl:
    case knopLetDecl:
    case knopVarDecl:
        sym = varDecl->AsParseNodeVar()->sym;
        break;
    case knopName:
        AnalysisAssert(varDecl->AsParseNodeName()->GetSymRef());
        sym = *varDecl->AsParseNodeName()->GetSymRef();
        break;
    default:
        AnalysisAssert(0);
        sym = nullptr;
        break;
    }

    if (sym->GetScope() != scope && sym->GetScope()->GetScopeType() != ScopeType_Parameter)
    {
        // This can happen when we have a function declared at global eval scope, and it has
        // references in deferred function bodies inside the eval. The BCG creates a new global scope
        // on such compiles, so we essentially have to migrate the symbol to the new scope.
        // We check fscrEvalCode, not fscrEval, because the same thing can happen in indirect eval,
        // when fscrEval is not set.
        Assert(scope->GetScopeType() == ScopeType_Global || scope->GetScopeType() == ScopeType_GlobalEvalBlock);
        scope->AddNewSymbol(sym);
    }

    Assert(sym && sym->GetScope() && (sym->GetScope() == scope || sym->GetScope()->GetScopeType() == ScopeType_Parameter));

    if (sym->NeedsScopeObject())
    {
        scope->SetIsObject();
    }

    return sym;
}